

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::GridProgram::shadeVertices
          (GridProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int i;
  long lVar2;
  ulong uVar3;
  Vector<float,_4> res;
  Vec4 v;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  if (0 < numPackets) {
    uVar3 = 0;
    do {
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib
                (&local_58,inputs + 1,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_68.m_data[lVar2] = local_48.m_data[lVar2] + local_58.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pVVar1 = packets[uVar3];
      *(undefined8 *)(pVVar1->position).m_data = local_68.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_68.m_data._8_8_;
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib
                (&local_68,inputs + 2,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
      pVVar1 = packets[uVar3];
      pVVar1->outputs[0].v.uData[0] = (deUint32)local_68.m_data[0];
      pVVar1->outputs[0].v.uData[1] = (deUint32)local_68.m_data[1];
      pVVar1->outputs[0].v.uData[2] = (deUint32)local_68.m_data[2];
      pVVar1->outputs[0].v.uData[3] = (deUint32)local_68.m_data[3];
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)numPackets);
  }
  return;
}

Assistant:

void GridProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx) + rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->outputs[0] = rr::readVertexAttribFloat(inputs[2], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
	}
}